

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O0

int mbedtls_asn1_write_bool(uchar **p,uchar *start,int boolean)

{
  long lVar1;
  undefined1 uVar2;
  int in_EDX;
  uchar **in_RSI;
  long *in_RDI;
  size_t len;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (*in_RDI - (long)in_RSI < 1) {
    local_4 = -0x6c;
  }
  else {
    uVar2 = 0;
    if (in_EDX != 0) {
      uVar2 = 0xff;
    }
    lVar1 = *in_RDI;
    *in_RDI = lVar1 + -1;
    *(undefined1 *)(lVar1 + -1) = uVar2;
    local_4 = mbedtls_asn1_write_len_and_tag
                        (in_RSI,(uchar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),1,'\0');
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_write_bool(unsigned char **p, const unsigned char *start, int boolean)
{
    size_t len = 0;

    if (*p - start < 1) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    *--(*p) = (boolean) ? 255 : 0;
    len++;

    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_BOOLEAN);
}